

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5f52c::CtorEvalExternalInterface::importGlobals
          (CtorEvalExternalInterface *this,GlobalValueSet *globals,Module *wasm_)

{
  Name *other;
  Global *__k;
  char *pcVar1;
  bool bVar2;
  long lVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  string *psVar6;
  long *plVar7;
  size_type *psVar8;
  _Base_ptr p_Var9;
  key_type *__k_00;
  pointer puVar10;
  _Base_ptr p_Var11;
  Name NVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  pointer local_f0;
  GlobalValueSet *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Base_ptr local_60;
  CtorEvalExternalInterface *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar10 = (wasm_->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (wasm_->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != local_f0) {
    local_60 = &(this->linkedInstances)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_e8 = globals;
    local_58 = this;
    do {
      __k = (puVar10->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(__k->super_Importable).module + 8) != (char *)0x0) {
        p_Var9 = (local_58->linkedInstances)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var9 == (_Base_ptr)0x0) {
LAB_00127f7b:
          psVar6 = (string *)__cxa_allocate_exception(0x20);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          local_a0.field_2._M_allocated_capacity._0_7_ = 0x4774726f706d69;
          local_a0.field_2._M_local_buf[7] = 'l';
          local_a0.field_2._8_7_ = 0x203a736c61626f;
          local_a0._M_string_length = 0xf;
          local_a0.field_2._M_local_buf[0xf] = '\0';
          pcVar1 = *(char **)((long)&(__k->super_Importable).module + 8);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,pcVar1,
                     *(long *)&(__k->super_Importable).module.super_IString.str + (long)pcVar1);
          std::operator+(&local_110,&local_a0,&local_c0);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_50._M_dataplus._M_p = (pointer)*plVar7;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_50._M_dataplus._M_p == psVar8) {
            local_50.field_2._M_allocated_capacity = *psVar8;
            local_50.field_2._8_4_ = (undefined4)plVar7[3];
            local_50.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          }
          else {
            local_50.field_2._M_allocated_capacity = *psVar8;
          }
          local_50._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          pcVar1 = *(char **)((long)&(__k->super_Importable).base + 8);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pcVar1,
                     *(long *)&(__k->super_Importable).base.super_IString.str + (long)pcVar1);
          std::operator+(&local_e0,&local_50,&local_80);
          *(string **)psVar6 = psVar6 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    (psVar6,local_e0._M_dataplus._M_p,
                     local_e0._M_dataplus._M_p + local_e0._M_string_length);
          __cxa_throw(psVar6,&(anonymous_namespace)::FailToEvalException::typeinfo,
                      FailToEvalException::~FailToEvalException);
        }
        other = &(__k->super_Importable).module;
        p_Var11 = local_60;
        do {
          bVar2 = wasm::IString::operator<((IString *)(p_Var9 + 1),&other->super_IString);
          if (!bVar2) {
            p_Var11 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[bVar2];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (p_Var11 == local_60) goto LAB_00127f7b;
        bVar2 = wasm::IString::operator<(&other->super_IString,(IString *)(p_Var11 + 1));
        if (bVar2) goto LAB_00127f7b;
        p_Var9 = p_Var11[1]._M_left;
        NVar12.super_IString.str._M_str = *(char **)&(__k->super_Importable).base.super_IString.str;
        NVar12.super_IString.str._M_len = *(size_t *)(p_Var9 + 1);
        lVar3 = wasm::Module::getExportOrNull(NVar12);
        if ((lVar3 == 0) || (*(int *)(lVar3 + 0x10) != 3)) {
          psVar6 = (string *)__cxa_allocate_exception(0x20);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          local_a0.field_2._M_allocated_capacity._0_7_ = 0x4774726f706d69;
          local_a0.field_2._M_local_buf[7] = 'l';
          local_a0.field_2._8_7_ = 0x203a736c61626f;
          local_a0._M_string_length = 0xf;
          local_a0.field_2._M_local_buf[0xf] = '\0';
          pcVar1 = *(char **)((long)&(__k->super_Importable).module + 8);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,pcVar1,
                     *(long *)&(__k->super_Importable).module.super_IString.str + (long)pcVar1);
          std::operator+(&local_110,&local_a0,&local_c0);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_50._M_dataplus._M_p = (pointer)*plVar7;
          psVar8 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_50._M_dataplus._M_p == psVar8) {
            local_50.field_2._M_allocated_capacity = *psVar8;
            local_50.field_2._8_4_ = (undefined4)plVar7[3];
            local_50.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          }
          else {
            local_50.field_2._M_allocated_capacity = *psVar8;
          }
          local_50._M_string_length = plVar7[1];
          *plVar7 = (long)psVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          pcVar1 = *(char **)((long)&(__k->super_Importable).base + 8);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pcVar1,
                     *(long *)&(__k->super_Importable).base.super_IString.str + (long)pcVar1);
          std::operator+(&local_e0,&local_50,&local_80);
          *(string **)psVar6 = psVar6 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    (psVar6,local_e0._M_dataplus._M_p,
                     local_e0._M_dataplus._M_p + local_e0._M_string_length);
          __cxa_throw(psVar6,&(anonymous_namespace)::FailToEvalException::typeinfo,
                      FailToEvalException::~FailToEvalException);
        }
        __k_00 = (key_type *)(lVar3 + 0x18);
        if (*(char *)(lVar3 + 0x28) != '\0') {
          __k_00 = (key_type *)0x0;
        }
        pmVar4 = std::
                 map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                 ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                               *)&p_Var9[1]._M_parent,__k_00);
        pmVar5 = std::
                 map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                 ::operator[](local_e8,(key_type *)__k);
        (pmVar5->super_SmallVector<wasm::Literal,_1UL>).usedFixed =
             (pmVar4->super_SmallVector<wasm::Literal,_1UL>).usedFixed;
        wasm::Literal::operator=
                  ((pmVar5->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                   (pmVar4->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::operator=
                  (&(pmVar5->super_SmallVector<wasm::Literal,_1UL>).flexible,
                   &(pmVar4->super_SmallVector<wasm::Literal,_1UL>).flexible);
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != local_f0);
  }
  return;
}

Assistant:

void importGlobals(GlobalValueSet& globals, Module& wasm_) override {
    ModuleUtils::iterImportedGlobals(wasm_, [&](Global* global) {
      auto it = linkedInstances.find(global->module);
      if (it != linkedInstances.end()) {
        auto* inst = it->second.get();
        auto* globalExport = inst->wasm.getExportOrNull(global->base);
        if (!globalExport || globalExport->kind != ExternalKind::Global) {
          throw FailToEvalException(std::string("importGlobals: ") +
                                    global->module.toString() + "." +
                                    global->base.toString());
        }
        globals[global->name] = inst->globals[*globalExport->getInternalName()];
      } else {
        throw FailToEvalException(std::string("importGlobals: ") +
                                  global->module.toString() + "." +
                                  global->base.toString());
      }
    });
  }